

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Type.h
# Opt level: O2

bool __thiscall
soul::Type::isValidArrayOrVectorRange<unsigned_long>
          (Type *this,unsigned_long start,unsigned_long end)

{
  bool bVar1;
  ArraySize AVar2;
  
  bVar1 = isValidArrayOrVectorIndex<unsigned_long>(this,start);
  if (bVar1) {
    bVar1 = isValidArrayOrVectorIndex<unsigned_long>(this,end);
    if (!bVar1) {
      AVar2 = getArrayOrVectorSize(this);
      if (AVar2 != end) goto LAB_001f4b05;
    }
    bVar1 = start < end;
  }
  else {
LAB_001f4b05:
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool isValidArrayOrVectorRange (IntType start, IntType end) const
    {
        return isValidArrayOrVectorIndex (start)
                && (isValidArrayOrVectorIndex (end) || (ArraySize) end == getArrayOrVectorSize())
                && convertArrayOrVectorIndexToValidRange (start) < convertArrayOrVectorIndexToValidRange (end)
                && end != 0;
    }